

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QtPrivate::QCalendarTextNavigator::updateDateLabel(QCalendarTextNavigator *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QLabel *this_00;
  QWidgetData *pQVar5;
  undefined8 uVar6;
  QPalette *pQVar7;
  QWidget *this_01;
  QBrush *abrush;
  long in_FS_OFFSET;
  int iVar8;
  int iVar9;
  int iVar10;
  QArrayDataPointer<char16_t> local_50;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_widget != (QWidget *)0x0) {
    QBasicTimer::start(&this->m_acceptTimer,this->m_editDelay,&this->super_QObject);
    this_00 = this->m_dateText;
    QCalendarDateValidator::currentText
              (&local_50,this->m_dateValidator,*(undefined8 *)&this->m_calendar);
    QLabel::setText(this_00,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar6 = (**(code **)(*(long *)&this->m_dateFrame->super_QWidget + 0x70))();
    pQVar5 = this->m_widget->data;
    uVar1 = (pQVar5->crect).x1;
    uVar3 = (pQVar5->crect).y1;
    uVar2 = (pQVar5->crect).x2;
    uVar4 = (pQVar5->crect).y2;
    iVar8 = (int)((ulong)uVar6 >> 0x20);
    iVar9 = ((uVar2 - (uVar1 + (int)uVar6)) + 1) / 2;
    iVar10 = ((uVar4 - (uVar3 + iVar8)) + 1) / 2;
    local_50.d = (Data *)CONCAT44(iVar10,iVar9);
    local_50.ptr = (char16_t *)CONCAT44(iVar8 + -1 + iVar10,(int)uVar6 + -1 + iVar9);
    QWidget::setGeometry(&this->m_dateFrame->super_QWidget,(QRect *)&local_50);
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = QWidget::palette(&this->m_dateFrame->super_QWidget);
    QPalette::QPalette((QPalette *)local_38,pQVar7);
    this_01 = QWidget::window(&this->m_dateFrame->super_QWidget);
    pQVar7 = QWidget::palette(this_01);
    abrush = QPalette::brush(pQVar7,Window);
    QPalette::setBrush((QPalette *)local_38,Window,abrush);
    pQVar7 = (QPalette *)local_38;
    QWidget::setPalette(&this->m_dateFrame->super_QWidget,(QPalette *)local_38);
    QWidget::raise(&this->m_dateFrame->super_QWidget,(int)pQVar7);
    QWidget::show(&this->m_dateFrame->super_QWidget);
    QPalette::~QPalette((QPalette *)local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarTextNavigator::updateDateLabel()
{
    if (!m_widget)
        return;

    m_acceptTimer.start(m_editDelay, this);

    m_dateText->setText(m_dateValidator->currentText(m_calendar));

    QSize s = m_dateFrame->sizeHint();
    QRect r = m_widget->geometry(); // later, just the table section
    QRect newRect((r.width() - s.width()) / 2, (r.height() - s.height()) / 2, s.width(), s.height());
    m_dateFrame->setGeometry(newRect);
    // need to set palette after geometry update as phonestyle sets transparency
    // effect in move event.
    QPalette p = m_dateFrame->palette();
    p.setBrush(QPalette::Window, m_dateFrame->window()->palette().brush(QPalette::Window));
    m_dateFrame->setPalette(p);

    m_dateFrame->raise();
    m_dateFrame->show();
}